

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

void smb_format_message(Curl_easy *data,smb_header *h,uchar cmd,size_t len)

{
  connectdata *pcVar1;
  smb_request *psVar2;
  __pid_t _Var3;
  ushort uVar4;
  
  pcVar1 = data->conn;
  psVar2 = (data->req).p.smb;
  h->nbt_type = '\0';
  h->nbt_flags = '\0';
  h->nbt_length = 0;
  h->magic[0] = '\0';
  h->magic[1] = '\0';
  h->magic[2] = '\0';
  h->magic[3] = '\0';
  h->command = '\0';
  h->status = 0;
  h->flags = '\0';
  h->flags2 = 0;
  h->pid_high = 0;
  h->signature[0] = '\0';
  h->signature[1] = '\0';
  h->signature[2] = '\0';
  h->signature[3] = '\0';
  h->signature[4] = '\0';
  h->signature[5] = '\0';
  *(undefined8 *)(h->signature + 6) = 0;
  h->uid = 0;
  h->mid = 0;
  uVar4 = (short)len + 0x20;
  h->nbt_length = uVar4 * 0x100 | uVar4 >> 8;
  h->magic[0] = 0xff;
  h->magic[1] = 'S';
  h->magic[2] = 'M';
  h->magic[3] = 'B';
  h->command = cmd;
  h->flags = '\x18';
  h->flags2 = 0x41;
  h->uid = (pcVar1->proto).smbc.uid;
  h->tid = psVar2->tid;
  _Var3 = getpid();
  h->pid_high = (unsigned_short)((uint)_Var3 >> 0x10);
  h->pid = (unsigned_short)_Var3;
  return;
}

Assistant:

static void smb_format_message(struct Curl_easy *data, struct smb_header *h,
                               unsigned char cmd, size_t len)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_request *req = data->req.p.smb;
  unsigned int pid;

  memset(h, 0, sizeof(*h));
  h->nbt_length = htons((unsigned short) (sizeof(*h) - sizeof(unsigned int) +
                                          len));
  memcpy((char *)h->magic, "\xffSMB", 4);
  h->command = cmd;
  h->flags = SMB_FLAGS_CANONICAL_PATHNAMES | SMB_FLAGS_CASELESS_PATHNAMES;
  h->flags2 = smb_swap16(SMB_FLAGS2_IS_LONG_NAME | SMB_FLAGS2_KNOWS_LONG_NAME);
  h->uid = smb_swap16(smbc->uid);
  h->tid = smb_swap16(req->tid);
  pid = getpid();
  h->pid_high = smb_swap16((unsigned short)(pid >> 16));
  h->pid = smb_swap16((unsigned short) pid);
}